

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::makeSIMDShift(TranslateToFuzzReader *this)

{
  SIMDShiftOp op;
  Expression *vec;
  Expression *shift;
  SIMDShift *pSVar1;
  
  op = Random::
       pick<wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp>
                 (&this->random,ShlVecI8x16,ShrSVecI8x16,ShrUVecI8x16,ShlVecI16x8,ShrSVecI16x8,
                  ShrUVecI16x8,ShlVecI32x4,ShrSVecI32x4,ShrUVecI32x4,ShlVecI64x2,ShrSVecI64x2,
                  ShrUVecI64x2);
  vec = make(this,(Type)0x6);
  shift = make(this,(Type)0x2);
  pSVar1 = Builder::makeSIMDShift(&this->builder,op,vec,shift);
  return (Expression *)pSVar1;
}

Assistant:

Expression* TranslateToFuzzReader::makeSIMDShift() {
  SIMDShiftOp op = pick(ShlVecI8x16,
                        ShrSVecI8x16,
                        ShrUVecI8x16,
                        ShlVecI16x8,
                        ShrSVecI16x8,
                        ShrUVecI16x8,
                        ShlVecI32x4,
                        ShrSVecI32x4,
                        ShrUVecI32x4,
                        ShlVecI64x2,
                        ShrSVecI64x2,
                        ShrUVecI64x2);
  Expression* vec = make(Type::v128);
  Expression* shift = make(Type::i32);
  return builder.makeSIMDShift(op, vec, shift);
}